

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::represent(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint Value;
  uint uVar1;
  uint dst;
  longlong lVar2;
  uint Value_00;
  size_t sVar3;
  double dVar4;
  double __x;
  double dVar5;
  char buffer [32];
  
  requireDStackAvailable(this,1,"REPRESENT");
  requireDStackDepth(this,2,"REPRESENT");
  requireFStackDepth(this,1,"REPRESENT");
  dVar4 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  dst = ForthStack<unsigned_int>::getTop(this_00,1);
  Value = this->False;
  sVar3 = 0x1f;
  if (uVar1 < 0x1f) {
    sVar3 = (size_t)uVar1;
  }
  uVar1 = this->True;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    __x = -dVar4;
    if (-dVar4 <= dVar4) {
      __x = dVar4;
    }
    dVar5 = log10(__x);
    dVar5 = floor(dVar5);
    Value_00 = (int)dVar5 + 1;
    dVar5 = pow(10.0,(double)(((int)dVar5 - (int)sVar3) + 1));
    lVar2 = llround(__x / dVar5);
    sprintf(buffer,"%lld",lVar2);
  }
  else {
    memset(buffer,0x30,sVar3);
    buffer[sVar3] = '\0';
    Value_00 = 0;
  }
  if (dVar4 < 0.0) {
    Value = uVar1;
  }
  sVar3 = strlen(buffer);
  moveIntoDataSpace(this,dst,buffer,sVar3);
  ForthStack<unsigned_int>::setTop(this_00,1,Value_00);
  ForthStack<unsigned_int>::setTop(this_00,Value);
  ForthStack<unsigned_int>::push(this_00,this->True);
  return;
}

Assistant:

void represent(){
			REQUIRE_DSTACK_AVAILABLE(1, "REPRESENT");
			REQUIRE_DSTACK_DEPTH(2, "REPRESENT");
			REQUIRE_FSTACK_DEPTH(1, "REPRESENT");
			auto number=fStack.getTop();fStack.pop();
			auto length=dStack.getTop();
			auto address = (dStack.getTop(1)); 
			auto Sign=False;
			if(number<0.0){
				Sign=True;
				number=-number;
			}
if(length>31) length=31;
int newLog{};
char buffer[32];
if(number!=0.0){
 double loga=std::log10(number);
 int logaint=static_cast<int>(floor(loga));
 int newlogDiv=logaint-(length-1);
 newLog=logaint+1; 
 double new_a=number/pow(10,newlogDiv);
 auto new_a_round=std::llround(new_a);
 sprintf(buffer,"%lld",new_a_round);
} else {
  std::memset(buffer,'0',length);
  buffer[length]=0;
}
moveIntoDataSpace(address,buffer,std::strlen(buffer));
			if (1){
				dStack.setTop(1,newLog);
				dStack.setTop(Sign);
				dStack.push(True);
			}
		}